

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::PostprocFiltersTestLarge_MD5Match_Test::
~PostprocFiltersTestLarge_MD5Match_Test(PostprocFiltersTestLarge_MD5Match_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__PostprocFiltersTest_0108a0f0;
  *(undefined ***)this = &PTR__PostprocFiltersTest_0108a148;
  *(undefined ***)(this + 8) = &PTR__PostprocFiltersTest_0108a168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(this + 0x3f0));
  *(undefined ***)(this + 8) = &PTR__EncoderTest_01081d70;
  if (*(PostprocFiltersTestLarge_MD5Match_Test **)(this + 0x3b0) != this + 0x3c0) {
    operator_delete(*(PostprocFiltersTestLarge_MD5Match_Test **)(this + 0x3b0));
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x10));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x10));
  return;
}

Assistant:

TEST_P(PostprocFiltersTestLarge, MD5Match) { DoTest(); }